

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

void __thiscall TIFFImageHandler::CalculateTiffTileSize(TIFFImageHandler *this,int inTileIndex)

{
  bool bVar1;
  bool bVar2;
  tmsize_t tVar3;
  long lVar4;
  T2P *pTVar5;
  tsize_t_compat *tbc;
  long local_28;
  
  pTVar5 = this->mT2p;
  if (pTVar5->pdf_transcode == T2P_TRANSCODE_RAW) {
    bVar1 = TileIsBottomEdge(this,inTileIndex);
    bVar2 = TileIsRightEdge(this,inTileIndex);
    if ((bVar1) || (bVar2)) {
      lVar4 = TIFFTileSize(pTVar5->input);
    }
    else {
      local_28 = 0;
      TIFFGetField(pTVar5->input,0x145,&local_28);
      lVar4 = *(long *)(local_28 + (long)inTileIndex * 8);
    }
    pTVar5 = this->mT2p;
  }
  else {
    tVar3 = TIFFTileSize(pTVar5->input);
    pTVar5 = this->mT2p;
    pTVar5->tiff_datasize = tVar3;
    if (pTVar5->tiff_planar != 2) {
      return;
    }
    lVar4 = tVar3 * (ulong)pTVar5->tiff_samplesperpixel;
  }
  pTVar5->tiff_datasize = lVar4;
  return;
}

Assistant:

void TIFFImageHandler::CalculateTiffTileSize(int inTileIndex)
{
	uint16_t edge=0;

	edge |= (uint16_t)TileIsRightEdge(inTileIndex);
	edge |= (uint16_t)TileIsBottomEdge(inTileIndex);
	
	if(mT2p->pdf_transcode==T2P_TRANSCODE_RAW)
	{
		if(edge)
		{
			mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		} else 
		{
			// 	TIFFTAG_TILEBYTECOUNTS changed in tiff 4.0.0;

			tsize_t_compat* tbc = NULL;
			TIFFGetField(mT2p->input, TIFFTAG_TILEBYTECOUNTS, &tbc);
			mT2p->tiff_datasize=static_cast<tsize_t>(tbc[inTileIndex]);
		}
	}
	else
	{
		mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		if(mT2p->tiff_planar==PLANARCONFIG_SEPARATE)
			mT2p->tiff_datasize*= mT2p->tiff_samplesperpixel;
	}
}